

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_VisibilityFeatureSetStrict_Test::
FeaturesTest_VisibilityFeatureSetStrict_Test(FeaturesTest_VisibilityFeatureSetStrict_Test *this)

{
  FeaturesTest_VisibilityFeatureSetStrict_Test *this_local;
  
  FeaturesTest::FeaturesTest(&this->super_FeaturesTest);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__FeaturesTest_VisibilityFeatureSetStrict_Test_029aca98;
  return;
}

Assistant:

TEST_F(FeaturesTest, VisibilityFeatureSetStrict) {
  BuildDescriptorMessagesInTestPool();

  ASSERT_THAT(ParseAndBuildFile("vis.proto", R"schema(
    edition = "2024";
    package naming;

    option features.default_symbol_visibility = STRICT;

    local message LocalOuter {
      local enum Inner {
        VAL_1 = 0;
      }
    }

    export message ExportOuter {
      enum Inner {
        VAL_1 = 0;
      }
    }
  )schema"),
              NotNull());
}